

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

int s2pred::ExpensiveSign(S2Point *a,S2Point *b,S2Point *c,bool perturb)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  double *ap;
  bool bVar5;
  
  lVar4 = 0;
  do {
    dVar1 = *(double *)((long)a->c_ + lVar4);
    dVar2 = *(double *)((long)b->c_ + lVar4);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
    bVar5 = lVar4 != 0x10;
    lVar4 = lVar4 + 8;
  } while (bVar5);
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    lVar4 = 0;
    do {
      dVar1 = *(double *)((long)b->c_ + lVar4);
      dVar2 = *(double *)((long)c->c_ + lVar4);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar5 = lVar4 != 0x10;
      lVar4 = lVar4 + 8;
    } while (bVar5);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      lVar4 = 0;
      do {
        dVar1 = *(double *)((long)c->c_ + lVar4);
        dVar2 = *(double *)((long)a->c_ + lVar4);
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
        bVar5 = lVar4 != 0x10;
        lVar4 = lVar4 + 8;
      } while (bVar5);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        iVar3 = StableSign(a,b,c);
        if (iVar3 != 0) {
          return iVar3;
        }
        iVar3 = ExactSign(a,b,c,perturb);
        return iVar3;
      }
    }
  }
  return 0;
}

Assistant:

int ExpensiveSign(const S2Point& a, const S2Point& b, const S2Point& c,
                  bool perturb) {
  // Return zero if and only if two points are the same.  This ensures (1).
  if (a == b || b == c || c == a) return 0;

  // Next we try recomputing the determinant still using floating-point
  // arithmetic but in a more precise way.  This is more expensive than the
  // simple calculation done by TriageSign(), but it is still *much* cheaper
  // than using arbitrary-precision arithmetic.  This optimization is able to
  // compute the correct determinant sign in virtually all cases except when
  // the three points are truly collinear (e.g., three points on the equator).
  int det_sign = StableSign(a, b, c);
  if (det_sign != 0) return det_sign;

  // TODO(ericv): Create a templated version of StableSign so that we can
  // retry in "long double" precision before falling back to ExactFloat.

  // TODO(ericv): Optimize ExactFloat so that it stores up to 32 bytes of
  // mantissa inline (without requiring memory allocation).

  // Otherwise fall back to exact arithmetic and symbolic permutations.
  return ExactSign(a, b, c, perturb);
}